

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BooPHF.h
# Opt level: O0

void __thiscall
boomphf::mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_>::setup
          (mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_> *this)

{
  pointer plVar1;
  __pid_t _Var2;
  size_type __new_size;
  pthread_t pt;
  u_int64_t uVar3;
  reference pvVar4;
  ulong uVar5;
  vector<boomphf::level,_std::allocator<boomphf::level>_> *in_RDI;
  __type _Var6;
  double dVar7;
  undefined1 auVar8 [16];
  int ii_2;
  int ii_1;
  uint64_t previous_idx;
  double sum_geom;
  int ii;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  double in_stack_ffffffffffffffb0;
  int local_28;
  int local_24;
  double local_20;
  int local_c;
  
  pthread_mutex_init((pthread_mutex_t *)
                     &in_RDI[0x19].
                      super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(pthread_mutexattr_t *)0x0);
  _Var2 = getpid();
  __new_size = (size_type)_Var2;
  pt = pthread_self();
  uVar3 = printPt(pt);
  *(int *)&in_RDI[0x19].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl.
           super__Vector_impl_data._M_finish = (int)__new_size + (int)uVar3;
  in_RDI[0x16].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  if (((ulong)in_RDI[0x16].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>.
              _M_impl.super__Vector_impl_data._M_finish & 0x100000000) != 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI,__new_size);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)in_RDI,__new_size);
  if (((ulong)in_RDI[0x18].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage & 0x1000000000000) != 0) {
    for (local_c = 0;
        local_c < *(int *)((long)&in_RDI[0x14].
                                  super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 4);
        local_c = local_c + 1) {
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    *)&in_RDI[0x17].
                       super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,(long)local_c);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI,__new_size);
    }
  }
  _Var6 = std::pow<double,unsigned_long>
                    (in_stack_ffffffffffffffb0,
                     CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  in_RDI[0x14].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(1.0 - _Var6);
  *(undefined4 *)
   &in_RDI[1].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl.
    super__Vector_impl_data._M_start = 0x19;
  std::vector<boomphf::level,_std::allocator<boomphf::level>_>::resize(in_RDI,__new_size);
  local_20 = 0.0;
  for (local_24 = 0;
      local_24 <
      *(int *)&in_RDI[1].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl
               .super__Vector_impl_data._M_start; local_24 = local_24 + 1) {
    in_stack_ffffffffffffffb0 = local_20;
    pvVar4 = std::vector<boomphf::level,_std::allocator<boomphf::level>_>::operator[]
                       (in_RDI,(long)local_24);
    pvVar4->idx_begin = (uint64_t)in_stack_ffffffffffffffb0;
    plVar1 = in_RDI[6].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl.
             super__Vector_impl_data._M_start;
    auVar8._8_4_ = (int)((ulong)plVar1 >> 0x20);
    auVar8._0_8_ = plVar1;
    auVar8._12_4_ = 0x45300000;
    _Var6 = std::pow<double,int>(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    dVar7 = ((auVar8._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)plVar1) - 4503599627370496.0)) * _Var6;
    uVar5 = (ulong)dVar7;
    pvVar4 = std::vector<boomphf::level,_std::allocator<boomphf::level>_>::operator[]
                       (in_RDI,(long)local_24);
    pvVar4->hash_domain =
         (uVar5 | (long)(dVar7 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f) + 0x3f &
         0xffffffffffffffc0;
    pvVar4 = std::vector<boomphf::level,_std::allocator<boomphf::level>_>::operator[]
                       (in_RDI,(long)local_24);
    if (pvVar4->hash_domain == 0) {
      pvVar4 = std::vector<boomphf::level,_std::allocator<boomphf::level>_>::operator[]
                         (in_RDI,(long)local_24);
      pvVar4->hash_domain = 0x40;
    }
    pvVar4 = std::vector<boomphf::level,_std::allocator<boomphf::level>_>::operator[]
                       (in_RDI,(long)local_24);
    local_20 = (double)(pvVar4->hash_domain + (long)local_20);
  }
  local_28 = 0;
  while( true ) {
    if (*(int *)&in_RDI[1].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>.
                 _M_impl.super__Vector_impl_data._M_start <= local_28) {
      return;
    }
    _Var6 = std::pow<double,int>(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    if (_Var6 < (double)*(float *)&in_RDI[0x16].
                                   super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>
                                   ._M_impl.super__Vector_impl_data._M_finish) break;
    local_28 = local_28 + 1;
  }
  *(int *)&in_RDI[0x18].super__Vector_base<boomphf::level,_std::allocator<boomphf::level>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage = local_28;
  return;
}

Assistant:

void setup()
		{
			pthread_mutex_init(&_mutex, NULL);

			_pid = getpid() + printPt(pthread_self()) ;// + pthread_self();
			//printf("pt self %llu  pid %i \n",printPt(pthread_self()),_pid);

			_cptTotalProcessed=0;

			
			if(_fastmode)
			{
				setLevelFastmode.resize(_percent_elem_loaded_for_fastMode * (double)_nelem );
			}

			
			bufferperThread.resize(_num_thread);
			if(_writeEachLevel)
			{
				for(int ii=0; ii<_num_thread; ii++)
				{
					bufferperThread[ii].resize(NBBUFF);
				}
			}
			
			_proba_collision = 1.0 -  pow(((_gamma*(double)_nelem -1 ) / (_gamma*(double)_nelem)),_nelem-1);

			double sum_geom =_gamma * ( 1.0 +  _proba_collision / (1.0 - _proba_collision));
			//printf("proba collision %f  sum_geom  %f   \n",_proba_collision,sum_geom);

			_nb_levels = 25;
			_levels.resize(_nb_levels);

			//build levels
			uint64_t previous_idx =0;
			for(int ii=0; ii<_nb_levels; ii++)
			{

				_levels[ii].idx_begin = previous_idx;

				// round size to nearest superior multiple of 64, makes it easier to clear a level
				_levels[ii].hash_domain =  (( (uint64_t) (_hash_domain * pow(_proba_collision,ii)) + 63) / 64 ) * 64;
				if(_levels[ii].hash_domain == 0 ) _levels[ii].hash_domain  = 64 ;
				previous_idx += _levels[ii].hash_domain;

				//printf("build level %i bit array : start %12llu, size %12llu  ",ii,_levels[ii]->idx_begin,_levels[ii]->hash_domain );
				//printf(" expected elems : %.2f %% total \n",100.0*pow(_proba_collision,ii));

			}
			
			for(int ii=0; ii<_nb_levels; ii++)
			{
				 if(pow(_proba_collision,ii) < _percent_elem_loaded_for_fastMode)
				 {
				 	_fastModeLevel = ii;
				 	 //printf("fast mode level :  %i \n",ii);
				 	break;
				 }
			}
		}